

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O0

void __thiscall Webcam::Webcam(Webcam *this,char *devName,uint width,uint height)

{
  bool bVar1;
  int local_24;
  uint local_20;
  int i;
  uint height_local;
  uint width_local;
  char *devName_local;
  Webcam *this_local;
  
  this->isOpen = false;
  dev_name = devName;
  local_20 = height;
  i = width;
  _height_local = devName;
  devName_local = &this->isOpen;
  bVar1 = open_device();
  if (bVar1) {
    this->isOpen = true;
    init_device((__u32 *)&i,&local_20);
    start_capturing();
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      imgBuffer[local_24].size = (int)buffers->length;
      imgBuffer[local_24].width = i;
      imgBuffer[local_24].height = local_20;
    }
  }
  else {
    this->isOpen = false;
  }
  return;
}

Assistant:

Webcam::Webcam(const char *devName, unsigned int width, unsigned int height)
{
    dev_name = (char *)devName;
    if(!open_device()) {
        isOpen = false;
        return;
    }
    isOpen = true;
    init_device (width, height);    //此处 若不适配的分辨率会自动被更正
    start_capturing ();

    for(int i=0; i<2; i++) {
        imgBuffer[i].size = buffers[0].length;
        imgBuffer[i].width  = width;
        imgBuffer[i].height = height;
    }
}